

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::IfcObject(IfcObject *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcRoot::IfcRoot((IfcRoot *)this,vtt + 2);
  pvVar1 = vtt[6];
  *(void **)&this->field_0x88 = pvVar1;
  *(void **)(&this->field_0x88 + *(long *)((long)pvVar1 + -0x18)) = vtt[7];
  pvVar1 = vtt[1];
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[8];
  *(void **)&this->field_0x88 = vtt[9];
  pp_Var2 = (_func_int **)vtt[10];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>)._vptr_ObjectHelper = pp_Var2;
  *(void **)(pp_Var2[-3] +
            (long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).
                   _vptr_ObjectHelper) = vtt[0xb];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0xc];
  *(void **)&this->field_0x88 = vtt[0xd];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0xe];
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x18 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x20 = 0;
  this->field_0xc8 = 0;
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}